

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

void __thiscall boundingBoxTy::enlarge(boundingBoxTy *this,positionTy *lPos)

{
  uint uVar1;
  double *pdVar2;
  positionTy *in_RSI;
  positionTy *in_RDI;
  double in_stack_00000080;
  double in_stack_00000088;
  boundingBoxTy *in_stack_00000090;
  
  pdVar2 = positionTy::lon(in_RDI);
  uVar1 = std::isnan(*pdVar2);
  if ((uVar1 & 1) == 0) {
    positionTy::lat(in_RSI);
    positionTy::lon(in_RSI);
    enlarge_pos(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  }
  else {
    memcpy(in_RDI + 1,in_RSI,0x48);
    memcpy(in_RDI,in_RDI + 1,0x48);
  }
  return;
}

Assistant:

void boundingBoxTy::enlarge (const positionTy& lPos)
{
    // in the special case that the bounding box isn't initialized
    // we make it the size of this point:
    if (std::isnan(nw.lon())) {
        nw = se = lPos;
        return;
    }
 
    enlarge_pos(lPos.lat(), lPos.lon());
}